

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::ArrowTableFunction::ArrowScanInitGlobal
          (ArrowTableFunction *this,ClientContext *context,TableFunctionInitInput *input)

{
  _Head_base<0UL,_duckdb::ArrowArrayStreamWrapper_*,_false> _Var1;
  size_type *psVar2;
  _Head_base<0UL,_duckdb::ArrowArrayStreamWrapper_*,_false> _Var3;
  ArrowScanFunctionData *function;
  pointer pAVar4;
  idx_t iVar5;
  const_reference __x;
  pointer *__ptr;
  unsigned_long *col_idx;
  size_type *psVar6;
  ArrowScanFunctionData *bind_data_p;
  _Head_base<0UL,_duckdb::ArrowScanGlobalState_*,_false> local_48;
  _Head_base<0UL,_duckdb::ArrowArrayStreamWrapper_*,_false> local_40;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> local_38;
  
  function = (ArrowScanFunctionData *)
             optional_ptr<const_duckdb::FunctionData,_true>::operator->(&input->bind_data);
  make_uniq<duckdb::ArrowScanGlobalState>();
  bind_data_p = function;
  ProduceArrowScan((duckdb *)&local_40,function,&input->column_ids,(input->filters).ptr);
  pAVar4 = unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
                         *)&local_48);
  _Var3._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ArrowArrayStreamWrapper *)0x0;
  _Var1._M_head_impl =
       (pAVar4->stream).
       super_unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ArrowArrayStreamWrapper_*,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
       .super__Head_base<0UL,_duckdb::ArrowArrayStreamWrapper_*,_false>._M_head_impl;
  (pAVar4->stream).
  super_unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ArrowArrayStreamWrapper_*,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
  .super__Head_base<0UL,_duckdb::ArrowArrayStreamWrapper_*,_false>._M_head_impl = _Var3._M_head_impl
  ;
  local_38._M_head_impl = (GlobalTableFunctionState *)this;
  if (_Var1._M_head_impl != (ArrowArrayStreamWrapper *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_ArrowArrayStreamWrapper + 0x10))();
    if (local_40._M_head_impl != (ArrowArrayStreamWrapper *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 0x10))();
    }
  }
  iVar5 = ArrowScanMaxThreads(context,(FunctionData *)bind_data_p);
  pAVar4 = unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
                         *)&local_48);
  pAVar4->max_threads = iVar5;
  if ((input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pAVar4 = unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
             ::operator->((unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
                           *)&local_48);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(pAVar4->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
               ,&(input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
              );
    psVar2 = (input->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (psVar6 = (input->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; psVar6 != psVar2; psVar6 = psVar6 + 1) {
      if (*psVar6 == 0xffffffffffffffff) {
        pAVar4 = unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
                 ::operator->((unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
                               *)&local_48);
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalTypeId_const&>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                   &pAVar4->scanned_types,&LogicalType::ROW_TYPE);
      }
      else {
        pAVar4 = unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
                 ::operator->((unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
                               *)&local_48);
        __x = vector<duckdb::LogicalType,_true>::get<true>(&function->all_types,*psVar6);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&(pAVar4->scanned_types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x);
      }
    }
  }
  (local_38._M_head_impl)->_vptr_GlobalTableFunctionState = (_func_int **)local_48._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(__uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )local_38._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> ArrowTableFunction::ArrowScanInitGlobal(ClientContext &context,
                                                                             TableFunctionInitInput &input) {
	auto &bind_data = input.bind_data->Cast<ArrowScanFunctionData>();
	auto result = make_uniq<ArrowScanGlobalState>();
	result->stream = ProduceArrowScan(bind_data, input.column_ids, input.filters.get());
	result->max_threads = ArrowScanMaxThreads(context, input.bind_data.get());
	if (!input.projection_ids.empty()) {
		result->projection_ids = input.projection_ids;
		for (const auto &col_idx : input.column_ids) {
			if (col_idx == COLUMN_IDENTIFIER_ROW_ID) {
				result->scanned_types.emplace_back(LogicalType::ROW_TYPE);
			} else {
				result->scanned_types.push_back(bind_data.all_types[col_idx]);
			}
		}
	}
	return std::move(result);
}